

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O3

int cfg_tobin_bool(void *reference,size_t bin_size,const_strarray *value)

{
  int iVar1;
  
  iVar1 = -1;
  if (bin_size == 1) {
    iVar1 = cfg_get_choice_index(value->value,cfg_get_choice_array_value,4,CFGLIST_BOOL_TRUE);
    *(bool *)reference = -1 < iVar1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
cfg_tobin_bool(void *reference, size_t bin_size, const struct const_strarray *value) {
  bool *ptr;

  if (bin_size != sizeof(*ptr)) {
    return -1;
  }

  ptr = (bool *)reference;

  *ptr = cfg_get_bool(strarray_get_first_c(value));
  return 0;
}